

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

void PairSearchHelper(ON_RTreeNode *a_nodeA,ON_RTreeBranch *a_branchB,
                     ON_RTreePairSearchCallbackResult *a_result)

{
  bool bVar1;
  ON_RTreeBranch *pOVar2;
  ON_RTreeBranch *branchAmax;
  ON_RTreeBranch *branchA;
  ON_RTreePairSearchCallbackResult *a_result_local;
  ON_RTreeBranch *a_branchB_local;
  ON_RTreeNode *a_nodeA_local;
  
  branchAmax = a_nodeA->m_branch;
  pOVar2 = branchAmax + a_nodeA->m_count;
  for (; branchAmax < pOVar2; branchAmax = branchAmax + 1) {
    bVar1 = PairSearchOverlapHelper(&branchAmax->m_rect,&a_branchB->m_rect,a_result->m_tolerance);
    if (bVar1) {
      if (a_nodeA->m_level < 1) {
        (*a_result->m_resultCallback)
                  (a_result->m_context,(ON__INT_PTR)(branchAmax->field_1).m_child,
                   (ON__INT_PTR)(a_branchB->field_1).m_child);
      }
      else {
        PairSearchHelper((branchAmax->field_1).m_child,a_branchB,a_result);
      }
    }
  }
  return;
}

Assistant:

static void PairSearchHelper( const ON_RTreeNode* a_nodeA, const ON_RTreeBranch* a_branchB, ON_RTreePairSearchCallbackResult* a_result )
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchA, *branchAmax;

  branchA = a_nodeA->m_branch;
  branchAmax = branchA + a_nodeA->m_count;
  while(branchA < branchAmax)
  {
    if ( PairSearchOverlapHelper( &branchA->m_rect, &a_branchB->m_rect, a_result->m_tolerance ) )
    {
      if ( a_nodeA->m_level > 0 )
      {
        PairSearchHelper(branchA->m_child,a_branchB,a_result);
      }
      else
      {
        a_result->m_resultCallback(a_result->m_context,branchA->m_id,a_branchB->m_id);
      }
    }
    branchA++;
  }
}